

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_of_12,int a_max_of_12)

{
  ImVec2 local_38;
  ImVec2 *local_30;
  ImVec2 *c;
  int a;
  int a_max_of_12_local;
  int a_min_of_12_local;
  float radius_local;
  ImVec2 *center_local;
  ImDrawList *this_local;
  
  c._4_4_ = a_max_of_12;
  a = a_min_of_12;
  a_max_of_12_local = (int)radius;
  _a_min_of_12_local = center;
  center_local = (ImVec2 *)this;
  if (((radius == 0.0) && (!NAN(radius))) || (a_max_of_12 < a_min_of_12)) {
    ImVector<ImVec2>::push_back(&this->_Path,center);
  }
  else {
    ImVector<ImVec2>::reserve(&this->_Path,(this->_Path).Size + (a_max_of_12 - a_min_of_12) + 1);
    for (c._0_4_ = a; (int)c <= c._4_4_; c._0_4_ = (int)c + 1) {
      local_30 = this->_Data->ArcFastVtx + (int)c % 0xc;
      ImVec2::ImVec2(&local_38,local_30->x * (float)a_max_of_12_local + _a_min_of_12_local->x,
                     local_30->y * (float)a_max_of_12_local + _a_min_of_12_local->y);
      ImVector<ImVec2>::push_back(&this->_Path,&local_38);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& center, float radius, int a_min_of_12, int a_max_of_12)
{
    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(center);
        return;
    }

    // For legacy reason the PathArcToFast() always takes angles where 2*PI is represented by 12,
    // but it is possible to set IM_DRAWLIST_ARCFAST_TESSELATION_MULTIPLIER to a higher value. This should compile to a no-op otherwise.
#if IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER != 1
    a_min_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
    a_max_of_12 *= IM_DRAWLIST_ARCFAST_TESSELLATION_MULTIPLIER;
#endif

    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = _Data->ArcFastVtx[a % IM_ARRAYSIZE(_Data->ArcFastVtx)];
        _Path.push_back(ImVec2(center.x + c.x * radius, center.y + c.y * radius));
    }
}